

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O3

boolean attack(monst *mtmp,schar dx,schar dy)

{
  int *piVar1;
  byte *pbVar2;
  ushort uVar3;
  int iVar4;
  level *lev;
  boolean bVar5;
  schar sVar6;
  byte bVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  obj *poVar15;
  char *pcVar16;
  char *pcVar17;
  attack *paVar18;
  permonst *ppVar19;
  monst *pmVar20;
  bool bVar21;
  char *pcVar22;
  ulong uVar23;
  uint uVar24;
  obj **ppoVar25;
  ulong uVar26;
  uchar uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int dhit;
  attack *local_1d8;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  ulong local_1c0;
  int sum [6];
  attack alt_attk;
  char buf [256];
  
  ppVar19 = mtmp->data;
  if (mtmp->mtame != '\0') {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00272954;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027294b;
        }
        else {
LAB_0027294b:
          if (ublindf == (obj *)0x0) goto LAB_00272a01;
LAB_00272954:
          if (ublindf->oartifact != '\x1d') goto LAB_00272a01;
        }
        if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
             (((youmonst.data)->mflags3 & 0x100) == 0)) ||
            ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)) || ((ppVar19->mflags3 & 0x200) == 0))
        goto LAB_00272a01;
      }
LAB_002729ac:
      uVar10 = *(uint *)&mtmp->field_0x60;
      if ((((uVar10 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar10 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_002729f4;
        goto LAB_00272a01;
      }
      if ((uVar10 & 0x280) != 0) goto LAB_00272a01;
LAB_002729f4:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_00272a01;
    }
    else {
      bVar5 = worm_known(level,mtmp);
      if (bVar5 != '\0') goto LAB_002729ac;
LAB_00272a01:
      if (((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar15 = which_armor(mtmp,4), poVar15 == (obj *)0x0 ||
          (poVar15 = which_armor(mtmp,4), poVar15->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00272a59;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00272a54;
        }
        else {
LAB_00272a54:
          if (ublindf != (obj *)0x0) {
LAB_00272a59:
            if (ublindf->oartifact == '\x1d') goto LAB_00272aec;
          }
          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_00272b53;
        }
LAB_00272aec:
        if ((u.uprops[0x19].extrinsic != 0) &&
           ((u.uprops[0x19].blocked == 0 &&
            (iVar9 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar9 < 0x41))))
        goto LAB_00272b53;
      }
      if ((u.uprops[0x42].intrinsic == 0) &&
         ((u.uprops[0x42].extrinsic == 0 && (bVar5 = match_warn_of_mon(mtmp), bVar5 == '\0'))))
      goto LAB_00272b75;
    }
LAB_00272b53:
    if ((((flags.safe_dog != '\0') && (u.uprops[0x1c].intrinsic == 0)) &&
        (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar5 = dmgtype(youmonst.data,0x24), bVar5 != '\0')))))) &&
       ((((u.uprops[0x1b].intrinsic == 0 && (u.umonnum != 0x9e)) &&
         ((youmonst.data)->mlet != '\x1c')) &&
        ((flags.forcefight == '\0' && ((uwep == (obj *)0x0 || (uwep->oartifact != '\x03')))))))) {
      uVar10 = mt_random();
      if (uVar10 * -0x49249249 < 0x24924925) {
        bVar21 = true;
      }
      else {
        ppVar19 = mtmp->data;
        bVar21 = ppVar19 == mons + 0x158 || (ppVar19 == mons + 0x76 || ppVar19 == mons + 0x74);
      }
      pcVar16 = in_rooms(level,mtmp->mx,mtmp->my,0x12);
      cVar8 = *pcVar16;
      while (cVar8 != '\0') {
        pcVar16 = pcVar16 + 1;
        bVar5 = tended_shop((mkroom *)((long)level->monsters + (long)cVar8 * 0xd8 + 0x3358));
        if (bVar5 != '\0') goto LAB_00274ca2;
        cVar8 = *pcVar16;
      }
      if ((bVar21) ||
         ((level->locations[u.ux][u.uy].typ < '\x11' && ((mtmp->data->mflags1 & 8) == 0)))) {
LAB_00274ca2:
        uVar10 = mt_random();
        monflee(mtmp,uVar10 % 6 + 1,'\0','\0');
        pcVar16 = y_monnam(mtmp);
        strcpy(buf,pcVar16);
        cVar8 = highc(buf[0]);
        buf[0] = cVar8;
        pcVar16 = "You stop.  %s is in the way!";
      }
      else {
        if (((mtmp->mfrozen == '\0') && ((mtmp->field_0x62 & 4) != 0)) &&
           (mtmp->data->mmove != '\0')) {
          return '\0';
        }
        uVar10 = mt_random();
        if ((uVar10 * -0x55555555 >> 1 | (uint)((uVar10 * -0x55555555 & 1) != 0) << 0x1f) <
            0x2aaaaaab) {
          return '\0';
        }
        Monnam(mtmp);
        pcVar16 = "%s doesn\'t seem to move!";
      }
      pline(pcVar16);
      nomul(0,(char *)0x0);
      return '\x01';
    }
  }
LAB_00272b75:
  override_confirmation = 0;
  bVar5 = attack_checks(mtmp,uwep,dx,dy,'\0');
  if (bVar5 != '\0') {
    return '\x01';
  }
  local_1c8 = (int)dy;
  local_1c4 = (int)dx;
  if ((u.umonnum == u.umonster) || (iVar9 = noattacks(youmonst.data), iVar9 == 0)) {
    bVar5 = check_capacity("You cannot fight while so heavily loaded.");
    if (bVar5 == '\0') {
      if ((u.twoweap != '\0') && (iVar9 = can_twoweapon(), iVar9 == 0)) {
        untwoweapon();
      }
      if ((unweapon != '\0') && (unweapon = '\0', flags.verbose != '\0')) {
        if (uwep == (obj *)0x0) {
          if ((((youmonst.data)->mflags1 & 0x2000) == 0) && ((youmonst.data)->msize != '\0')) {
            pcVar16 = "bash";
            if (urole.malenum == 0x160) {
              pcVar16 = "strik";
            }
            pcVar22 = "gloved";
            if (uarmg == (obj *)0x0) {
              pcVar22 = "bare";
            }
            pcVar17 = body_part(6);
            pcVar17 = makeplural(pcVar17);
            pline("You begin %sing monsters with your %s %s.",pcVar16,pcVar22,pcVar17);
          }
        }
        else {
          pcVar16 = aobjnam(uwep,(char *)0x0);
          pline("You begin bashing monsters with your %s.",pcVar16);
        }
      }
      exercise(0,'\x01');
      u_wipe_engr(3);
      if ((((ppVar19->mlet == '\f') && (mtmp->mfrozen == '\0')) &&
          ((*(uint *)&mtmp->field_0x60 & 0x2a0000) == 0x20000)) &&
         (uVar10 = mt_random(), uVar10 * -0x49249249 < 0x24924925)) {
        iVar9 = m_move(mtmp,0);
        if (iVar9 == 2) {
          return '\0';
        }
        if ((u.ux + local_1c4 != (int)mtmp->mx) || (u.uy + local_1c8 != (int)mtmp->my)) {
          return '\0';
        }
      }
      sVar6 = find_roll_to_hit(mtmp);
      iVar4 = u.umonnum;
      iVar9 = u.umonster;
      local_1cc = (int)sVar6;
      if ((u.umonnum != u.umonster) || (urace.malenum == 0xe8)) {
        dhit = 0;
        uVar23 = 0;
        do {
          sum[uVar23] = 0;
          paVar18 = getmattk(youmonst.data,(int)uVar23,sum,&alt_attk);
          uVar27 = paVar18->aatyp;
          poVar15 = uwep;
          switch(uVar27) {
          case '\0':
          case '\x0e':
            goto switchD_00273040_caseD_0;
          case '\x01':
            if (uwep == (obj *)0x0 || uVar23 != 0) {
              if (uVar23 != 1 || uwep == (obj *)0x0) goto switchD_00273040_caseD_2;
              if (u.umonnum - 0x12fU < 2) goto LAB_002733c2;
              goto LAB_002732e5;
            }
            if ((((youmonst.data)->mflags1 & 0x2000) == 0) && ((youmonst.data)->msize != '\0'))
            goto LAB_002733c2;
          case '\x03':
          case '\x04':
          case '\x05':
          case '\x06':
switchD_00273040_caseD_3:
            if (uwep == (obj *)0x0 || uVar23 != 0) {
LAB_00273330:
              poVar15 = uwep;
              if (uwep == (obj *)0x0) {
                if ((u.twoweap != '\0') && (uswapwep != (obj *)0x0)) {
                  poVar15 = (obj *)0x0;
                  goto LAB_0027335c;
                }
              }
              else {
LAB_0027335c:
                ppVar19 = mtmp->data;
                if (ppVar19 == mons + 0x127 || (ppVar19 == mons + 0xb || ppVar19 == mons + 0xc))
                break;
LAB_0027339b:
                if (((uVar23 == 0) && (poVar15 != (obj *)0x0)) && ((youmonst.data)->mlet == '&'))
                goto LAB_002733c2;
              }
              if (((((u.umonnum != 0x9e && u.uprops[0x1b].intrinsic == 0) &&
                     (youmonst.data == mons + 0x32 || youmonst.data == mons + 0x31)) &&
                   ((youmonst.data)->mlet != '\x1c')) && (u.uprops[0x1c].intrinsic == 0)) &&
                 (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
                  ((u.umonnum != u.umonster && (bVar5 = dmgtype(youmonst.data,0x24), bVar5 != '\0'))
                  )))) {
                ppVar19 = mtmp->data;
                iVar14 = (int)ppVar19;
                iVar12 = (int)((ulong)ppVar19 >> 0x20);
                auVar38._0_4_ = -(uint)(iVar14 == 0x30b2c0);
                auVar38._4_4_ = -(uint)(iVar12 == 0);
                auVar38._8_4_ = -(uint)(iVar14 == 0x309ec0);
                auVar38._12_4_ = -(uint)(iVar12 == 0);
                auVar33._4_4_ = auVar38._0_4_;
                auVar33._0_4_ = auVar38._4_4_;
                auVar33._8_4_ = auVar38._12_4_;
                auVar33._12_4_ = auVar38._8_4_;
                auVar36._0_4_ = -(uint)(iVar14 == 0x306c00);
                auVar36._4_4_ = -(uint)(iVar12 == 0);
                auVar36._8_4_ = -(uint)(iVar14 == 0x306bc0);
                auVar36._12_4_ = -(uint)(iVar12 == 0);
                auVar39._4_4_ = auVar36._0_4_;
                auVar39._0_4_ = auVar36._4_4_;
                auVar39._8_4_ = auVar36._12_4_;
                auVar39._12_4_ = auVar36._8_4_;
                auVar40 = packssdw(auVar39 & auVar36,auVar33 & auVar38);
                auVar31._0_4_ = -(uint)(iVar14 == 0x30ba40);
                auVar31._4_4_ = -(uint)(iVar12 == 0);
                auVar31._8_4_ = -(uint)(iVar14 == 0x309fc0);
                auVar31._12_4_ = -(uint)(iVar12 == 0);
                auVar34._4_4_ = auVar31._0_4_;
                auVar34._0_4_ = auVar31._4_4_;
                auVar34._8_4_ = auVar31._12_4_;
                auVar34._12_4_ = auVar31._8_4_;
                auVar30._0_4_ = -(uint)(iVar14 == 0x30ba00);
                auVar30._4_4_ = -(uint)(iVar12 == 0);
                auVar30._8_4_ = -(uint)(iVar14 == 0x30ba80);
                auVar30._12_4_ = -(uint)(iVar12 == 0);
                auVar28._4_4_ = auVar30._0_4_;
                auVar28._0_4_ = auVar30._4_4_;
                auVar28._8_4_ = auVar30._12_4_;
                auVar28._12_4_ = auVar30._8_4_;
                auVar29 = packssdw(auVar28 & auVar30,auVar34 & auVar31);
                auVar29 = packssdw(auVar29,auVar40);
                if (((((((((auVar29 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                          (auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar29 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar29 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar29 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar29[0xf] < '\0') || ppVar19 == mons + 299) break;
              }
              uVar10 = mt_random();
              iVar14 = uVar10 % 0x14 + 1;
              dhit = (byte)(iVar14 < local_1cc | u._1052_1_) & 1;
              if (iVar14 < local_1cc || (u._1052_1_ & 1) != 0) {
                if (((u._1052_1_ & 1) == 0) &&
                   (iVar14 = could_seduce(&youmonst,mtmp,paVar18), iVar14 != 0)) {
                  pcVar16 = "talk to";
                  if (((mtmp->field_0x62 & 2) != 0) &&
                     (pcVar16 = "talk to", (mtmp->data->mflags1 & 0x1000) == 0)) {
                    pcVar16 = "smile at";
                  }
                  pcVar22 = mon_nam(mtmp);
                  pcVar17 = "seductively";
                  if (iVar14 == 2) {
                    pcVar17 = "engagingly";
                  }
                  pline("You %s %s %s.",pcVar16,pcVar22,pcVar17);
                  iVar14 = damageum(mtmp,paVar18);
                  sum[uVar23] = iVar14;
                }
                else {
                  wakeup(mtmp);
                  if (mtmp->data == mons + 299) {
                    if ((uarmf == (obj *)0x0 || paVar18->aatyp != '\x03') ||
                       (pcVar16 = "You kick %s.", (uarmf->field_0x4a & 2) == 0)) {
                      pcVar16 = mon_nam(mtmp);
                      pline("Your attack passes harmlessly through %s.",pcVar16);
                      break;
                    }
                  }
                  else {
                    bVar7 = paVar18->aatyp - 2;
                    pcVar16 = "You hit %s.";
                    if (bVar7 < 0xf) {
                      pcVar16 = &DAT_002d7a34 + *(int *)(&DAT_002d7a34 + (ulong)bVar7 * 4);
                    }
                  }
                  pcVar22 = mon_nam(mtmp);
                  pline(pcVar16,pcVar22);
                  if (((mtmp->data == mons + 0xdb) && ((mtmp->field_0x61 & 1) == 0)) &&
                     (1 < mtmp->mhp)) {
                    uVar27 = paVar18->aatyp;
                    if (uarmf == (obj *)0x0 || uVar27 != '\x03') {
                      if ((uarmg == (obj *)0x0) ||
                         (((uVar27 != '\x01' && (uVar27 != 0xfe)) && (uVar27 != '\x05')))) {
                        if (uarmh == (obj *)0x0 || uVar27 != '\x04') {
                          pcVar16 = mons_mname(mons + 0xdb);
                          pcVar16 = an(pcVar16);
                          sprintf(buf,"touching %s",pcVar16);
                          iVar14 = instadisintegrate(buf);
                          mtmp->mhp = mtmp->mhp - iVar14;
                        }
                        else if ((objects[uarmh->otyp].oc_oprop != '\x04') &&
                                (bVar5 = obj_resists(uarmh,5,0x32), bVar5 == '\0')) {
                          ppoVar25 = &uarmh;
                          goto LAB_00273d9c;
                        }
                      }
                      else if ((objects[uarmg->otyp].oc_oprop != '\x04') &&
                              (bVar5 = obj_resists(uarmg,5,0x32), bVar5 == '\0')) {
                        ppoVar25 = &uarmg;
                        goto LAB_00273d9c;
                      }
LAB_00273fb7:
                      sum[uVar23] = 1;
                      uVar10 = 0;
                    }
                    else {
                      if ((objects[uarmf->otyp].oc_oprop == '\x04') ||
                         (bVar5 = obj_resists(uarmf,5,0x32), bVar5 != '\0')) goto LAB_00273fb7;
                      ppoVar25 = &uarmf;
LAB_00273d9c:
                      bVar5 = is_quest_artifact(*ppoVar25);
                      if (bVar5 != '\0') goto LAB_00273fb7;
                      uVar24 = (*ppoVar25)->owt;
                      uVar10 = 0;
                      destroy_arm(*ppoVar25,'\0');
                      sum[uVar23] = 1;
                      if (uVar24 != 0) {
                        uVar26 = (ulong)uVar24 / 100;
                        if ((int)uVar24 < 0x65) {
                          uVar26 = 1;
                        }
                        uVar10 = mt_random();
                        uVar10 = (uint)((ulong)uVar10 % uVar26);
                        if (4 < uVar10) {
                          uVar10 = 5;
                        }
                        uVar10 = ~uVar10;
                      }
                    }
                    iVar14 = uVar10 + mtmp->mhp;
                    if (iVar14 < 2) {
                      iVar14 = 1;
                    }
                    mtmp->mhp = iVar14;
                  }
                  else {
                    iVar14 = damageum(mtmp,paVar18);
                    sum[uVar23] = iVar14;
                  }
                }
                break;
              }
              missum(mtmp,paVar18);
              goto LAB_00274521;
            }
            if ((youmonst.data)->mlet != '&') goto LAB_0027335c;
LAB_002733c2:
            local_1c0 = uVar23;
            iVar12 = hitval(uwep,mtmp);
            iVar13 = weapon_hit_bonus(uwep);
            iVar14 = local_1cc;
            iVar13 = iVar12 + local_1cc + iVar13;
            uVar10 = mt_random();
            dieroll = uVar10 % 0x14 + 1;
            dhit = (byte)(dieroll < iVar13 | u._1052_1_) & 1;
            local_1cc = iVar14;
            if (uwep == (obj *)0x0) {
              local_1cc = iVar13;
            }
            bVar5 = known_hitum(mtmp,&dhit,paVar18,(schar)local_1c4,(schar)local_1c8);
            uVar23 = local_1c0;
            if (bVar5 == '\0') {
              sum[local_1c0] = 2;
              break;
            }
            sum[local_1c0] = dhit;
            pmVar20 = level->monsters[(long)u.ux + (long)dx][(long)u.uy + (long)dy];
            if (pmVar20 == (monst *)0x0) {
              pmVar20 = (monst *)0x0;
            }
            else if ((pmVar20->field_0x61 & 2) != 0) {
              pmVar20 = (monst *)0x0;
            }
            if (pmVar20 != mtmp) goto LAB_00274923;
            if (((dhit != 0) && (paVar18->adtyp != '\0')) && (paVar18->adtyp != 0xf1)) {
LAB_0027350f:
              iVar14 = damageum(mtmp,paVar18);
              sum[uVar23] = iVar14;
            }
            break;
          case '\x02':
switchD_00273040_caseD_2:
            if (uVar23 == 0) goto switchD_00273040_caseD_3;
LAB_002732e5:
            if ((((((youmonst.data)->mlet == '0') || (((youmonst.data)->mflags2 & 0x100) != 0)) &&
                 ((u.uprops[0x1b].intrinsic == 0 &&
                  ((u.umonnum != 0x9e && ((youmonst.data)->mlet != '\x1c')))))) &&
                (u.uprops[0x1c].intrinsic == 0)) &&
               (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
                ((u.umonnum != u.umonster && (bVar5 = dmgtype(youmonst.data,0x24), bVar5 != '\0'))))
               )) {
              ppVar19 = mtmp->data;
              iVar14 = (int)ppVar19;
              iVar12 = (int)((ulong)ppVar19 >> 0x20);
              auVar41._0_4_ = -(uint)(iVar14 == 0x30b2c0);
              auVar41._4_4_ = -(uint)(iVar12 == 0);
              auVar41._8_4_ = -(uint)(iVar14 == 0x309ec0);
              auVar41._12_4_ = -(uint)(iVar12 == 0);
              auVar43._4_4_ = auVar41._0_4_;
              auVar43._0_4_ = auVar41._4_4_;
              auVar43._8_4_ = auVar41._12_4_;
              auVar43._12_4_ = auVar41._8_4_;
              auVar37._0_4_ = -(uint)(iVar14 == 0x306c00);
              auVar37._4_4_ = -(uint)(iVar12 == 0);
              auVar37._8_4_ = -(uint)(iVar14 == 0x306bc0);
              auVar37._12_4_ = -(uint)(iVar12 == 0);
              auVar42._4_4_ = auVar37._0_4_;
              auVar42._0_4_ = auVar37._4_4_;
              auVar42._8_4_ = auVar37._12_4_;
              auVar42._12_4_ = auVar37._8_4_;
              auVar43 = packssdw(auVar42 & auVar37,auVar43 & auVar41);
              auVar32._0_4_ = -(uint)(iVar14 == 0x30ba40);
              auVar32._4_4_ = -(uint)(iVar12 == 0);
              auVar32._8_4_ = -(uint)(iVar14 == 0x309fc0);
              auVar32._12_4_ = -(uint)(iVar12 == 0);
              auVar35._4_4_ = auVar32._0_4_;
              auVar35._0_4_ = auVar32._4_4_;
              auVar35._8_4_ = auVar32._12_4_;
              auVar35._12_4_ = auVar32._8_4_;
              auVar40._0_4_ = -(uint)(iVar14 == 0x30ba00);
              auVar40._4_4_ = -(uint)(iVar12 == 0);
              auVar40._8_4_ = -(uint)(iVar14 == 0x30ba80);
              auVar40._12_4_ = -(uint)(iVar12 == 0);
              auVar29._4_4_ = auVar40._0_4_;
              auVar29._0_4_ = auVar40._4_4_;
              auVar29._8_4_ = auVar40._12_4_;
              auVar29._12_4_ = auVar40._8_4_;
              auVar29 = packssdw(auVar29 & auVar40,auVar35 & auVar32);
              auVar29 = packssdw(auVar29,auVar43);
              if (((((((((auVar29 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                        (auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar29 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar29 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar29 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar29[0xf] < '\0') || ppVar19 == mons + 299) break;
            }
            goto LAB_00273330;
          case '\a':
            dhit = 1;
            wakeup(mtmp);
            if (mtmp->data == mons + 299) {
              pcVar16 = mon_nam(mtmp);
              pcVar22 = "Your hug passes harmlessly through %s.";
LAB_00273aef:
              pline(pcVar22,pcVar16);
              break;
            }
            bVar5 = sticks(mtmp->data);
            if ((bVar5 != '\0') || ((u._1052_1_ & 1) != 0)) break;
            if (u.ustuck == mtmp) {
              pcVar16 = Monnam(mtmp);
              pcVar22 = "crushed";
              if (u.umonnum == 0x102) {
                pcVar22 = "choked";
              }
              pline("%s is being %s.",pcVar16,pcVar22);
              iVar14 = damageum(mtmp,paVar18);
              sum[uVar23] = iVar14;
              break;
            }
            if (((uVar23 < 2) || (sum[uVar23 - 1] == 0)) || (sum[uVar23 - 2] == 0)) break;
            pcVar16 = mon_nam(mtmp);
            pline("You grab %s!",pcVar16);
            u.ustuck = mtmp;
            goto LAB_0027350f;
          case '\b':
          case '\t':
switchD_00273040_caseD_8:
            warning("strange attack of yours (%d)");
            break;
          case '\n':
          case '\f':
          case '\x0f':
            dhit = 0;
            goto LAB_00274521;
          case '\v':
            uVar10 = mt_random();
            iVar14 = uVar10 % ((int)uVar23 + 0x14U) + 1;
            dhit = (int)(iVar14 < local_1cc);
            if (local_1cc <= iVar14) {
              missum(mtmp,paVar18);
              goto LAB_00274521;
            }
            wakeup(mtmp);
            ppVar19 = mtmp->data;
            if (ppVar19 == mons + 299) {
              pcVar16 = mon_nam(mtmp);
              pcVar22 = "Your attempt to surround %s is harmless.";
              goto LAB_00273aef;
            }
            uVar10 = (uint)paVar18->damn;
            local_1d8 = paVar18;
            if (paVar18->damn == 0) {
              uVar10 = 0;
            }
            else {
              bVar7 = paVar18->damd;
              uVar24 = uVar10;
              do {
                uVar11 = mt_random();
                uVar10 = uVar10 + uVar11 % (uint)bVar7;
                uVar24 = uVar24 - 1;
              } while (uVar24 != 0);
              ppVar19 = mtmp->data;
            }
            if (ppVar19->msize < 4) {
              if ((u.uhunger < 0x5dc) && ((u._1052_1_ & 1) == 0)) {
                poVar15 = mtmp->minvent;
                if (poVar15 != (obj *)0x0) {
                  do {
                    snuff_lit(poVar15);
                    poVar15 = poVar15->nobj;
                  } while (poVar15 != (obj *)0x0);
                  ppVar19 = mtmp->data;
                }
                if (ppVar19 == mons + 0xc) {
                  if (u.uprops[8].extrinsic == 0) goto LAB_00273e23;
                }
                else {
                  if ((ppVar19 == mons + 0xb) && (u.uprops[8].extrinsic == 0)) {
LAB_00273e23:
                    if (((byte)youmonst.mintrinsics & 0x80) == 0) {
                      pcVar16 = mon_nam(mtmp);
                      pline("You bite into %s.",pcVar16);
                      pcVar16 = mons_mname(mtmp->data);
                      pcVar16 = an(pcVar16);
                      sprintf(buf,"swallowing %s whole",pcVar16);
                      delayed_petrify((char *)0x0,buf);
                      goto LAB_002744f6;
                    }
                  }
                  if (ppVar19 == mons + 0xdb) {
                    if (u.uprops[4].intrinsic == 0 && u.uprops[4].extrinsic == 0) {
                      if (((byte)youmonst.mintrinsics & 8) == 0) goto LAB_002741cf;
                    }
                    else if (((((u.uprops[4].intrinsic >> 0x1a & 1) != 0) &&
                              ((u.uprops[4].intrinsic & 0xfbffffff) == 0 &&
                               u.uprops[4].extrinsic == 0)) &&
                             (((byte)youmonst.mintrinsics & 8) == 0)) &&
                            (uVar24 = mt_random(),
                            (uVar24 * -0x33333333 >> 1 |
                            (uint)((uVar24 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a)) {
LAB_002741cf:
                      pcVar16 = mon_nam(mtmp);
                      pline("You bite into %s.",pcVar16);
                      pcVar16 = mons_mname(mtmp->data);
                      pcVar16 = an(pcVar16);
                      sprintf(buf,"swallowing %s whole",pcVar16);
                      instadisintegrate(buf);
                      goto LAB_002744f6;
                    }
                  }
                }
                if ((((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
                      (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0)) ||
                    (u.uprops[0xd].blocked != 0)) ||
                   ((u.uprops[0xc].intrinsic != 0 ||
                    ((u.uprops[0xc].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x1000000) != 0))
                    )))) {
                  local_1c0 = CONCAT44(local_1c0._4_4_,(int)mtmp->mx);
                  cVar8 = mtmp->my;
                  map_location((int)u.ux,(int)u.uy,1);
                  lev = level;
                  if ((u.uprops[0x23].intrinsic == 0) ||
                     ((u.uprops[0x24].extrinsic != 0 ||
                      ((u.umonnum != u.umonster &&
                       (bVar5 = dmgtype(youmonst.data,0x24), bVar5 != '\0')))))) {
                    iVar14 = (int)youmonst.mnum;
                  }
                  else {
                    iVar14 = display_rng(0x193);
                  }
                  dbuf_set(lev,(int)local_1c0,(int)cVar8,(rm *)0x0,-1,-1,-1,-1,-1,-1,0,iVar14 + 1,0,
                           0);
                }
                pcVar16 = mon_nam(mtmp);
                pline("You engulf %s!",pcVar16);
                (*windowprocs.win_delay)();
                (*windowprocs.win_delay)();
                ppVar19 = youmonst.data;
                switch(local_1d8->adtyp) {
                case '\0':
                  pcVar16 = Monnam(mtmp);
                  if (ppVar19 == mons + 0x6e) {
                    pline("%s is laden with your moisture.",pcVar16);
                    ppVar19 = mtmp->data;
                    if ((ppVar19 != mons + 0x157 &&
                        (ppVar19 != mons + 0xa0 &&
                        (ppVar19 != mons + 0x20 && ppVar19 != mons + 0x73))) &&
                        (ppVar19->mflags1 & 0x600) != 0) {
                      pcVar16 = Monnam(mtmp);
                      pcVar22 = "%s seems unharmed.";
                      goto LAB_00274435;
                    }
                  }
                  else {
                    pline("%s is pummeled with your debris!",pcVar16);
                  }
                  break;
                case '\x01':
                case '\x04':
                case '\x05':
                case '\a':
                case '\t':
                case '\n':
                  break;
                case '\x02':
                  uVar24 = mt_random();
                  if ((uVar24 & 1) != 0) {
                    uVar3 = mtmp->mintrinsics;
                    pcVar22 = Monnam(mtmp);
                    uVar3 = uVar3 & 1;
                    pcVar16 = "%s seems mildly hot.";
                    pcVar17 = "%s is burning to a crisp!";
                    goto LAB_0027438a;
                  }
LAB_002742d5:
                  uVar10 = 0;
                  break;
                case '\x03':
                  uVar24 = mt_random();
                  if ((uVar24 & 1) == 0) goto LAB_002742d5;
                  uVar3 = mtmp->mintrinsics;
                  pcVar22 = Monnam(mtmp);
                  uVar3 = uVar3 & 2;
                  pcVar16 = "%s seems mildly chilly.";
                  pcVar17 = "%s is freezing to death!";
LAB_0027438a:
                  if (uVar3 == 0) {
                    pcVar16 = pcVar17;
                  }
                  if (uVar3 != 0) {
                    uVar10 = 0;
                  }
                  pline(pcVar16,pcVar22);
                  golemeffects(mtmp,(uint)local_1d8->adtyp,uVar10);
                  break;
                case '\x06':
                  uVar24 = mt_random();
                  if ((uVar24 & 1) == 0) goto LAB_002742c0;
                  pcVar16 = mon_nam(mtmp);
                  pline("The air around %s crackles with electricity.",pcVar16);
                  if ((mtmp->mintrinsics & 0x10) != 0) {
                    pcVar16 = Monnam(mtmp);
                    uVar10 = 0;
                    pline("%s seems unhurt.",pcVar16);
                  }
                  golemeffects(mtmp,(uint)local_1d8->adtyp,uVar10);
                  break;
                case '\b':
                  pcVar16 = Monnam(mtmp);
                  pline("%s is covered with your goo!",pcVar16);
                  if ((mtmp->mintrinsics & 0x40) != 0) {
                    pcVar16 = mon_nam(mtmp);
                    pcVar22 = "It seems harmless to %s.";
LAB_00274435:
                    uVar10 = 0;
                    pline(pcVar22,pcVar16);
                  }
                  break;
                case '\v':
                  bVar5 = can_blnd(&youmonst,mtmp,local_1d8->aatyp,(obj *)0x0);
                  if (bVar5 != '\0') {
                    uVar24 = *(uint *)&mtmp->field_0x60;
                    if ((uVar24 >> 0x11 & 1) != 0) {
                      pcVar16 = Monnam(mtmp);
                      pline("%s can\'t see in there!",pcVar16);
                      uVar24 = *(uint *)&mtmp->field_0x60;
                    }
                    *(uint *)&mtmp->field_0x60 = uVar24 & 0xfffdffff;
                    iVar14 = uVar10 + mtmp->mblinded;
                    if (0x7e < iVar14) {
                      iVar14 = 0x7f;
                    }
                    mtmp->mblinded = (uchar)iVar14;
                  }
LAB_002742c0:
                  uVar10 = 0;
                  break;
                default:
                  if (local_1d8->adtyp != '\x1a') break;
                  ppVar19 = mtmp->data;
                  if (ppVar19 == mons + 0x145 ||
                      (ppVar19 == mons + 0x146 || ppVar19 == mons + 0x144)) {
                    pline("Unfortunately, digesting any of it is fatal.");
                    end_engulf(mtmp);
                    pcVar16 = mons_mname(mtmp->data);
                    sprintf(gulpum_msgbuf,"unwisely tried to eat %s",pcVar16);
                    killer = gulpum_msgbuf;
                    killer_format = 2;
                    done(0);
                    goto LAB_002744f6;
                  }
                  if (u.uprops[0x3f].extrinsic != 0 || u.uprops[0x3f].intrinsic != 0) {
                    uVar10 = 0;
                    break;
                  }
                  bVar7 = ppVar19->mlet;
                  uVar26 = (ulong)bVar7;
                  if (uVar26 < 0x21) {
                    if ((0x102400404U >> (uVar26 & 0x3f) & 1) != 0) goto LAB_002745cb;
                    if (uVar26 != 0x1f) goto LAB_00274722;
                    if (ppVar19 != mons + 0x9e) goto LAB_002745cb;
                    uVar10 = 7;
                  }
                  else {
LAB_00274722:
                    if (((ppVar19 == mons + 0x104 || ppVar19 == mons + 0x106) || bVar7 != 0x37) &&
                       (bVar7 != 0x36)) {
                      uVar10 = 7;
                      if (bVar7 == 0x2a) {
                        uVar10 = ppVar19 == mons + 0xd6 | 6;
                      }
                    }
                    else {
LAB_002745cb:
                      uVar10 = 5;
                    }
                  }
                  violated(uVar10);
                  poVar15 = mlifesaver(mtmp);
                  if (poVar15 != (obj *)0x0) {
                    m_useup(mtmp,poVar15);
                  }
                  newuhs('\0');
                  xkilled(mtmp,2);
                  if (mtmp->mhp < 1) {
                    bVar7 = *(byte *)((long)&mtmp->data->cwt + 1);
                    bVar5 = corpse_chance(mtmp,&youmonst,'\x01');
                    iVar14 = 0;
                    if ((bVar5 != '\0') &&
                       (iVar12 = monsndx(mtmp->data), (mvitals[iVar12].mvflags & 0x10) == 0)) {
                      iVar14 = bVar7 + 1;
                      u.uhunger = u.uhunger + (mtmp->data->cnutrit + 1 >> 1);
                    }
                    pcVar16 = mon_nam(mtmp);
                    sprintf(gulpum_msgbuf,"You totally digest %s.",pcVar16);
                    if (iVar14 == 0) {
                      pline("%s",gulpum_msgbuf);
                    }
                    else {
                      pcVar16 = mon_nam(mtmp);
                      pline("You digest %s.",pcVar16);
                      nomul(-(iVar14 <<
                             (u.uprops[0x3f].extrinsic != 0 || u.uprops[0x3f].intrinsic != 0)),
                            "digesting something");
                      nomovemsg = gulpum_msgbuf;
                    }
                    if (mtmp->data == mons + 0xd7) {
                      pcVar16 = mons_mname(mons + 0xd7);
                      pcVar16 = The(pcVar16);
                      sprintf(gulpum_msgbuf,"%s isn\'t sitting well with you.",pcVar16);
                      if (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) {
                        u.uprops[0x3a].intrinsic = 5;
                        iflags.botl = '\x01';
                      }
                    }
                    else {
                      exercise(4,'\x01');
                    }
                  }
                  else {
                    pcVar16 = body_part(0x12);
                    pline("You hurriedly regurgitate the sizzling in your %s.",pcVar16);
                  }
                  end_engulf(mtmp);
                  goto LAB_00274826;
                }
                end_engulf(mtmp);
                piVar1 = &mtmp->mhp;
                iVar14 = *piVar1;
                *piVar1 = *piVar1 - uVar10;
                if ((*piVar1 == 0 || SBORROW4(iVar14,uVar10) != *piVar1 < 0) &&
                   (killed(mtmp), mtmp->mhp < 1)) {
LAB_00274826:
                  sum[uVar23] = 2;
                  cVar8 = mtmp->data->mlet;
                  if (((cVar8 == '4') || (paVar18 = local_1d8, cVar8 == '\'')) &&
                     ((((uVar10 = mt_random(), paVar18 = local_1d8,
                        0x33333333 < uVar10 * -0x33333333 && (u.uprops[0x34].intrinsic == 0)) &&
                       (youmonst.data != mons + 0xfd && (youmonst.data)->mlet != ' ')) &&
                      (bVar5 = defends(0x21,uwep), paVar18 = local_1d8, bVar5 == '\0')))) {
                    pcVar16 = "very ";
                    if (u.uprops[0x1d].intrinsic == 0) {
                      pcVar16 = "";
                    }
                    pline("You feel %ssick.",pcVar16);
                    uVar10 = mt_random();
                    mdamageu(mtmp,(uVar10 & 7) + 1);
                    paVar18 = local_1d8;
                  }
                  break;
                }
                pcVar16 = "regurgitate";
                if (((youmonst.data)->mflags1 >> 0x12 & 1) == 0) {
                  pcVar16 = "expel";
                }
                pcVar22 = mon_nam(mtmp);
                pline("You %s %s!",pcVar16,pcVar22);
                if ((u.uprops[0x3f].extrinsic != 0 || u.uprops[0x3f].intrinsic != 0) ||
                   (((youmonst.data)->mflags1 & 0x40000) != 0)) {
                  pcVar16 = mon_nam(mtmp);
                  pcVar16 = s_suffix(pcVar16);
                  pcVar22 = "Obviously, you didn\'t like %s taste.";
                  goto LAB_00273bf6;
                }
              }
            }
            else {
              pcVar16 = Monnam(mtmp);
              pcVar22 = "%s is too large to be engulfed.";
LAB_00273bf6:
              pline(pcVar22,pcVar16);
            }
LAB_002744f6:
            sum[uVar23] = 0;
            paVar18 = local_1d8;
            break;
          case '\r':
            dhit = -1;
            wakeup(mtmp);
            uVar10 = (uint)paVar18->damn;
            if (paVar18->damn == 0) {
              uVar10 = 0;
            }
            else {
              bVar7 = paVar18->damd;
              uVar24 = uVar10;
              do {
                uVar11 = mt_random();
                uVar10 = uVar10 + uVar11 % (uint)bVar7;
                uVar24 = uVar24 - 1;
              } while (uVar24 != 0);
            }
            pline("You explode!");
            iVar14 = 1;
            switch(paVar18->adtyp) {
            case '\x02':
              bVar7 = (byte)mtmp->mintrinsics;
              break;
            case '\x03':
              bVar7 = (byte)mtmp->mintrinsics >> 1;
              break;
            case '\x04':
            case '\x05':
            case '\a':
            case '\b':
            case '\t':
            case '\n':
              goto switchD_00273840_caseD_4;
            case '\x06':
              bVar7 = (byte)mtmp->mintrinsics >> 4;
              break;
            case '\v':
              bVar5 = resists_blnd(mtmp);
              if (bVar5 == '\0') {
                pcVar16 = Monnam(mtmp);
                pline("%s is blinded by your flash of light!",pcVar16);
                iVar12 = uVar10 + mtmp->mblinded;
                uVar27 = (uchar)iVar12;
                if (0x7e < iVar12) {
                  uVar27 = '\x7f';
                }
                mtmp->mblinded = uVar27;
                mtmp->field_0x62 = mtmp->field_0x62 & 0xfd;
              }
              goto switchD_00273840_caseD_4;
            default:
              if (paVar18->adtyp != '$') goto switchD_00273840_caseD_4;
              if (((mtmp->data->mflags1 & 0x1000) == 0) && ((mtmp->field_0x62 & 2) != 0)) {
                pcVar16 = Monnam(mtmp);
                pline("%s is affected by your flash of light!",pcVar16);
                mtmp->field_0x62 = mtmp->field_0x62 | 0x20;
              }
              goto LAB_00273bcf;
            }
            if ((bVar7 & 1) == 0) {
              pcVar16 = Monnam(mtmp);
              pline("%s gets blasted!",pcVar16);
              piVar1 = &mtmp->mhp;
              iVar12 = *piVar1;
              *piVar1 = *piVar1 - uVar10;
              if (*piVar1 == 0 || SBORROW4(iVar12,uVar10) != *piVar1 < 0) {
                killed(mtmp);
                iVar14 = 2;
              }
            }
            else {
              shieldeff(mtmp->mx,mtmp->my);
              if (mtmp->data->mlet == '7') {
                golemeffects(mtmp,(uint)paVar18->adtyp,uVar10);
              }
              else {
                pcVar16 = mon_nam(mtmp);
                pline("The blast doesn\'t seem to affect %s.",pcVar16);
              }
switchD_00273840_caseD_4:
            }
LAB_00273bcf:
            sum[uVar23] = iVar14;
            break;
          case '\x10':
            goto LAB_0027339b;
          default:
            if (uVar27 != 0xfe) {
              if (uVar27 != 0xff) goto switchD_00273040_caseD_8;
              if (((uVar23 != 0) || (0x21 < (ulong)(byte)(youmonst.data)->mlet)) ||
                 ((0x200008800U >> ((ulong)(byte)(youmonst.data)->mlet & 0x3f) & 1) == 0))
              goto switchD_00273040_caseD_0;
            }
            goto LAB_002733c2;
          }
          if (dhit == -1) {
            u.mh = -1;
            rehumanize();
          }
LAB_00274521:
          if (sum[uVar23] == 2) {
            passive(mtmp,'\x01',0,paVar18->aatyp);
            goto LAB_00274923;
          }
          passive(mtmp,(boolean)sum[uVar23],1,paVar18->aatyp);
          if (((u.umonnum != u.umonster) != (iVar4 != iVar9)) || (multi < 0)) goto LAB_00274923;
switchD_00273040_caseD_0:
          uVar23 = uVar23 + 1;
          if (uVar23 == 6) goto LAB_00274923;
        } while( true );
      }
      paVar18 = (youmonst.data)->mattk;
      uVar10 = mt_random();
      dieroll = uVar10 % 0x14 + 1;
      buf._0_4_ = (byte)(dieroll < local_1cc | u._1052_1_) & 1;
      if (dieroll < local_1cc) {
        exercise(3,'\x01');
      }
      bVar5 = known_hitum(mtmp,(int *)buf,paVar18,(schar)local_1c4,(schar)local_1c8);
      passive(mtmp,buf[0],(int)bVar5,0xfe);
      goto LAB_00274923;
    }
  }
  else {
    pline("You have no way to attack monsters physically.");
LAB_00274923:
    pbVar2 = (byte *)((long)&mtmp->mstrategy + 3);
    *pbVar2 = *pbVar2 & 0xcf;
  }
  if (flags.forcefight == '\0') {
    return '\x01';
  }
  if (mtmp->mhp < 1) {
    return '\x01';
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00274a00;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002749a3;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027499a;
    }
    else {
LAB_0027499a:
      if (ublindf == (obj *)0x0) goto LAB_00274a4e;
LAB_002749a3:
      if (ublindf->oartifact != '\x1d') goto LAB_00274a4e;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))
       && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_00274a00;
  }
  else {
    bVar5 = worm_known(level,mtmp);
    if (bVar5 != '\0') {
LAB_00274a00:
      uVar10 = *(uint *)&mtmp->field_0x60;
      if ((((uVar10 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar10 & 0x280) == 0) goto LAB_00274a40;
      }
      else if (((uVar10 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00274a40:
        if ((u._1052_1_ & 0x20) == 0) {
          return '\x01';
        }
      }
    }
  }
LAB_00274a4e:
  if (((mtmp->data->mflags1 & 0x10000) != 0) ||
     ((poVar15 = which_armor(mtmp,4), poVar15 != (obj *)0x0 &&
      (poVar15 = which_armor(mtmp,4), poVar15->otyp == 0x4f)))) goto LAB_00274b65;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00274a9f;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00274a9a;
  }
  else {
LAB_00274a9a:
    if (ublindf != (obj *)0x0) {
LAB_00274a9f:
      if (ublindf->oartifact == '\x1d') goto LAB_00274b32;
    }
    if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
         (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
         youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) {
      return '\x01';
    }
  }
LAB_00274b32:
  if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
     (iVar9 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar9 < 0x41)) {
    return '\x01';
  }
LAB_00274b65:
  if ((((u.uprops[0x42].intrinsic == 0) && (u.uprops[0x42].extrinsic == 0)) &&
      ((bVar5 = match_warn_of_mon(mtmp), bVar5 == '\0' &&
       ((level->locations[(long)dx + (long)u.ux][(long)dy + (long)u.uy].field_0x6 & 8) == 0)))) &&
     (((u._1052_1_ & 1) == 0 || (u.ustuck != mtmp)))) {
    map_invisible(u.ux + dx,u.uy + dy);
  }
  return '\x01';
}

Assistant:

boolean attack(struct monst *mtmp, schar dx, schar dy)
{
	schar tmp;
	const struct permonst *mdat = mtmp->data;

	/* This section of code provides protection against accidentally
	 * hitting peaceful (like '@') and tame (like 'd') monsters.
	 * Protection is provided as long as player is not: blind, confused,
	 * hallucinating or stunned.
	 * changes by wwp 5/16/85
	 * More changes 12/90, -dkh-. if its tame and safepet, (and protected
	 * 07/92) then we assume that you're not trying to attack. Instead,
	 * you'll usually just swap places if this is a movement command
	 */
	/* Intelligent chaotic weapons (Stormbringer) want blood */
	if (is_safepet(level, mtmp) && !flags.forcefight) {
	    if (!uwep || uwep->oartifact != ART_STORMBRINGER) {
		/* there are some additional considerations: this won't work
		 * if in a shop or you miss a random roll or
		 * if you can walk thru walls and your pet cannot (KAA) or
		 * if your pet is a long worm (unless someone does better).
		 * there's also a chance of displacing a "frozen" monster.
		 * sleeping monsters might magically walk in their sleep.
		 */
		boolean foo = (!rn2(7) || is_longworm(mtmp->data)),
			inshop = FALSE;
		char *p;

		for (p = in_rooms(level, mtmp->mx, mtmp->my, SHOPBASE); *p; p++)
		    if (tended_shop(&level->rooms[*p - ROOMOFFSET])) {
			inshop = TRUE;
			break;
		    }

		if (inshop || foo ||
			(IS_ROCK(level->locations[u.ux][u.uy].typ) &&
					!passes_walls(mtmp->data))) {
		    char buf[BUFSZ];

		    monflee(mtmp, rnd(6), FALSE, FALSE);
		    strcpy(buf, y_monnam(mtmp));
		    buf[0] = highc(buf[0]);
		    pline("You stop.  %s is in the way!", buf);
		    nomul(0, NULL);
		    return TRUE;
		} else if ((mtmp->mfrozen || (! mtmp->mcanmove)
				|| (mtmp->data->mmove == 0)) && rn2(6)) {
		    pline("%s doesn't seem to move!", Monnam(mtmp));
		    nomul(0, NULL);
		    return TRUE;
		} else return FALSE;
	    }
	}

	/* possibly set in attack_checks;
	   examined in known_hitum, called via hitum or hmonas below */
	override_confirmation = FALSE;
	if (attack_checks(mtmp, uwep, dx, dy, FALSE))
	    return TRUE;

	if (Upolyd) {
		/* certain "pacifist" monsters don't attack */
		if (noattacks(youmonst.data)) {
			pline("You have no way to attack monsters physically.");
			mtmp->mstrategy &= ~STRAT_WAITMASK;
			goto atk_done;
		}
	}

	if (check_capacity("You cannot fight while so heavily loaded."))
	    goto atk_done;

	if (u.twoweap && !can_twoweapon())
		untwoweapon();

	if (unweapon) {
	    unweapon = FALSE;
	    if (flags.verbose) {
		if (uwep)
		    pline("You begin bashing monsters with your %s.",
			aobjnam(uwep, NULL));
		else if (!cantwield(youmonst.data))
		    pline("You begin %sing monsters with your %s %s.",
			Role_if (PM_MONK) ? "strik" : "bash",
			uarmg ? "gloved" : "bare",	/* Del Lamb */
			makeplural(body_part(HAND)));
	    }
	}
	exercise(A_STR, TRUE);		/* you're exercising muscles */
	/* andrew@orca: prevent unlimited pick-axe attacks */
	u_wipe_engr(3);

	/* Is the "it died" check actually correct? */
	if (mdat->mlet == S_LEPRECHAUN && !mtmp->mfrozen && !mtmp->msleeping &&
	   !mtmp->mconf && mtmp->mcansee && !rn2(7) &&
	   (m_move(mtmp, 0) == 2 ||			    /* it died */
	   mtmp->mx != u.ux + dx || mtmp->my != u.uy + dy)) /* it moved */
		return FALSE;

	tmp = find_roll_to_hit(mtmp);
	if (Upolyd || Race_if(PM_VAMPIRE))
		hmonas(mtmp, tmp, dx, dy);
	else
		hitum(mtmp, tmp, youmonst.data->mattk, dx, dy);
	mtmp->mstrategy &= ~STRAT_WAITMASK;

atk_done:
	/* see comment in attack_checks() */
	/* we only need to check for this if we did an attack_checks()
	 * and it returned 0 (it's okay to attack), and the monster didn't
	 * evade.
	 */
	if (flags.forcefight && mtmp->mhp > 0 && !canspotmon(level, mtmp) &&
	    !level->locations[u.ux+dx][u.uy+dy].mem_invis &&
	    !(u.uswallow && mtmp == u.ustuck))
		map_invisible(u.ux+dx, u.uy+dy);

	return TRUE;
}